

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

vector<hta::Row,_std::allocator<hta::Row>_> *
hta::convert_timeaggregates_to_rows
          (vector<hta::Row,_std::allocator<hta::Row>_> *__return_storage_ptr__,
          vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *tas,Duration interval,
          int smooth_factor)

{
  bool bVar1;
  size_type sVar2;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<hta::Row,_std::allocator<hta::Row>_>_> __result;
  reference pTVar3;
  TimeAggregate *ta;
  iterator __end2;
  iterator __begin2;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *__range2;
  reference pTStack_68;
  int current_count;
  TimeAggregate *current;
  int smooth_factor_local;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *tas_local;
  Duration interval_local;
  vector<hta::Row,_std::allocator<hta::Row>_> *rows;
  
  tas_local = (vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)interval.__r;
  interval_local.__r = (rep)__return_storage_ptr__;
  std::vector<hta::Row,_std::allocator<hta::Row>_>::vector(__return_storage_ptr__);
  sVar2 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::size(tas);
  std::vector<hta::Row,_std::allocator<hta::Row>_>::reserve
            (__return_storage_ptr__,(sVar2 / (ulong)(long)smooth_factor - 1) + (long)smooth_factor);
  if (smooth_factor == 1) {
    __first = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::begin(tas);
    __last = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::end(tas);
    __result = std::back_inserter<std::vector<hta::Row,std::allocator<hta::Row>>>
                         (__return_storage_ptr__);
    std::
    transform<__gnu_cxx::__normal_iterator<hta::TimeAggregate*,std::vector<hta::TimeAggregate,std::allocator<hta::TimeAggregate>>>,std::back_insert_iterator<std::vector<hta::Row,std::allocator<hta::Row>>>,hta::convert_timeaggregates_to_rows(std::vector<hta::TimeAggregate,std::allocator<hta::TimeAggregate>>&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,int)::__0>
              ((__normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                )__first._M_current,
               (__normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                )__last._M_current,__result,(anon_class_8_1_09ec0a43)tas_local);
  }
  else {
    if (smooth_factor < 2) {
      __assert_fail("smooth_factor > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                    ,0x147,
                    "std::vector<Row> hta::convert_timeaggregates_to_rows(std::vector<TimeAggregate> &, Duration, int)"
                   );
    }
    pTStack_68 = (TimeAggregate *)0x0;
    __range2._4_4_ = 0;
    __end2 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::begin(tas);
    ta = (TimeAggregate *)
         std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::end(tas);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                                       *)&ta), bVar1) {
      pTVar3 = __gnu_cxx::
               __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
               ::operator*(&__end2);
      if (pTStack_68 == (TimeAggregate *)0x0) {
        __range2._4_4_ = 1;
        pTStack_68 = pTVar3;
      }
      else {
        Aggregate::operator+=(&pTStack_68->aggregate,pTVar3->aggregate);
        __range2._4_4_ = __range2._4_4_ + 1;
      }
      if (__range2._4_4_ == smooth_factor) {
        std::vector<hta::Row,std::allocator<hta::Row>>::
        emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::TimeAggregate&>
                  ((vector<hta::Row,std::allocator<hta::Row>> *)__return_storage_ptr__,
                   (duration<long,_std::ratio<1L,_1000000000L>_> *)&tas_local,pTStack_68);
        pTStack_68 = (TimeAggregate *)0x0;
      }
      __gnu_cxx::
      __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
      ::operator++(&__end2);
    }
    if (pTStack_68 != (TimeAggregate *)0x0) {
      std::vector<hta::Row,std::allocator<hta::Row>>::
      emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::TimeAggregate&>
                ((vector<hta::Row,std::allocator<hta::Row>> *)__return_storage_ptr__,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)&tas_local,pTStack_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Row> convert_timeaggregates_to_rows(std::vector<TimeAggregate>& tas,
                                                       Duration interval, int smooth_factor)
{
    std::vector<Row> rows;
    rows.reserve(tas.size() / smooth_factor + smooth_factor - 1);
    if (smooth_factor == 1)
    {
        std::transform(tas.begin(), tas.end(), std::back_inserter(rows),
                       [interval](TimeAggregate ta) -> Row {
                           return { interval, ta };
                       });
    }
    else
    {
        assert(smooth_factor > 1);
        TimeAggregate* current = nullptr;
        int current_count = 0;
        for (TimeAggregate& ta : tas)
        {
            if (!current)
            {
                current = &ta;
                current_count = 1;
            }
            else
            {
                current->aggregate += ta.aggregate;
                current_count++;
            }
            if (current_count == smooth_factor)
            {
                rows.emplace_back(interval, *current);
                current = nullptr;
            }
        }
        if (current)
        {
            rows.emplace_back(interval, *current);
        }
    }
    return rows;
}